

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O3

int av1_log_block_avg(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs,int mi_row,int mi_col)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000011;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  iVar1 = (cpi->common).height;
  uVar2 = CONCAT71(in_register_00000011,bs) & 0xffffffff;
  iVar3 = mi_row * 4;
  iVar4 = ((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar2]
          + mi_row) * 4;
  if (iVar1 <= iVar4) {
    iVar4 = iVar1;
  }
  if (iVar3 < iVar4) {
    iVar1 = (cpi->common).width;
    iVar5 = ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar2] + mi_col) * 4;
    if (iVar1 <= iVar5) {
      iVar5 = iVar1;
    }
    uVar2 = 0;
    uVar6 = 0;
    do {
      if (mi_col * 4 < iVar5) {
        lVar7 = (long)(mi_col * 4);
        do {
          uVar2 = (ulong)((int)uVar2 +
                         (uint)*(ushort *)
                                ((long)x->plane[0].src.buf * 2 +
                                 (long)iVar3 * (long)x->plane[0].src.stride * 2 + lVar7 * 2));
          lVar7 = lVar7 + 1;
        } while (iVar5 != lVar7);
        uVar6 = uVar6 + iVar5 + mi_col * -4;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar4);
    if (uVar6 != 0) {
      return (int)(uVar2 / uVar6);
    }
  }
  return 0;
}

Assistant:

int av1_log_block_avg(const AV1_COMP *cpi, const MACROBLOCK *x, BLOCK_SIZE bs,
                      int mi_row, int mi_col) {
  // This functions returns the block average of luma block
  unsigned int sum, avg, num_pix;
  int r, c;
  const int pic_w = cpi->common.width;
  const int pic_h = cpi->common.height;
  const int bw = MI_SIZE * mi_size_wide[bs];
  const int bh = MI_SIZE * mi_size_high[bs];
  const uint16_t *x16 = CONVERT_TO_SHORTPTR(x->plane[0].src.buf);

  sum = 0;
  num_pix = 0;
  avg = 0;
  int row = mi_row << MI_SIZE_LOG2;
  int col = mi_col << MI_SIZE_LOG2;
  for (r = row; (r < (row + bh)) && (r < pic_h); r++) {
    for (c = col; (c < (col + bw)) && (c < pic_w); c++) {
      sum += *(x16 + r * x->plane[0].src.stride + c);
      num_pix++;
    }
  }
  if (num_pix != 0) {
    avg = sum / num_pix;
  }
  return avg;
}